

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedatabase.cpp
# Opt level: O0

QStringList * __thiscall
QMimeDatabasePrivate::mimeTypeForFileName(QMimeDatabasePrivate *this,QString *fileName)

{
  bool bVar1;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  QStringList *matchingMimeTypes;
  QMimeGlobMatchResult result;
  undefined4 in_stack_fffffffffffffec8;
  CaseSensitivity in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  CaseSensitivity in_stack_fffffffffffffed4;
  QString *in_stack_fffffffffffffed8;
  undefined1 *puVar2;
  QChar in_stack_fffffffffffffeee;
  QList<QString> *in_stack_fffffffffffffef8;
  initializer_list<QString> in_stack_ffffffffffffff00;
  QString *in_stack_ffffffffffffff18;
  long *plVar3;
  QMimeDatabasePrivate *in_stack_ffffffffffffff20;
  long *plVar4;
  QChar local_22;
  long local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QChar::QChar<char16_t,_true>(&local_22,L'/');
  bVar1 = QString::endsWith(in_stack_fffffffffffffed8,in_stack_fffffffffffffeee,
                            in_stack_fffffffffffffed4);
  if (bVar1) {
    directoryMimeType();
    QList<QString>::QList(in_stack_fffffffffffffef8,in_stack_ffffffffffffff00);
    plVar3 = local_20;
    plVar4 = &local_8;
    do {
      plVar4 = plVar4 + -3;
      QString::~QString((QString *)0x8e2f55);
    } while (plVar4 != plVar3);
  }
  else {
    puVar2 = &DAT_aaaaaaaaaaaaaaaa;
    findByFileName(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    (in_RDI->d).size = (qsizetype)puVar2;
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    QList<QString>::QList
              ((QList<QString> *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (QList<QString> *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    QListSpecialMethods<QString>::sort
              ((QListSpecialMethods<QString> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffecc);
    QMimeGlobMatchResult::~QMimeGlobMatchResult
              ((QMimeGlobMatchResult *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)
              );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QMimeDatabasePrivate::mimeTypeForFileName(const QString &fileName)
{
    if (fileName.endsWith(u'/'))
        return { directoryMimeType() };

    const QMimeGlobMatchResult result = findByFileName(fileName);
    QStringList matchingMimeTypes = result.m_matchingMimeTypes;
    matchingMimeTypes.sort(); // make it deterministic
    return matchingMimeTypes;
}